

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_sx_sy_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong in_RSI;
  ulong uVar14;
  void *in_RDI;
  ulong in_R8;
  uint in_R9D;
  undefined8 in_XMM0_Qa;
  uint8_t *in_XMM0_Qb;
  undefined1 auVar16 [16];
  undefined8 uVar15;
  undefined8 uVar19;
  undefined1 auVar17 [16];
  __m128i *v_m0_b_00;
  undefined1 auVar18 [16];
  __m128i alVar20;
  __m128i v_val_w;
  __m128i v_val_w_00;
  __m128i v;
  void *in_stack_00000008;
  uint in_stack_00000010;
  uint32_t in_stack_00000018;
  uint32_t in_stack_00000020;
  __m128i v_res_b_1;
  __m128i v_m1_b_1;
  __m128i v_m0_b_1;
  __m128i v_m0_w_1;
  __m128i v_rs_w_1;
  __m128i v_r1_s_w_1;
  __m128i v_r0_s_w_1;
  __m128i v_r_s_b_1;
  __m128i v_rvs_b_1;
  __m128i v_rb_b_1;
  __m128i v_ra_b_1;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i v_m0_w;
  __m128i v_rs_w;
  __m128i v_r1_s_w;
  __m128i v_r0_s_w;
  __m128i v_r_s_b;
  __m128i v_rvs_b;
  __m128i v_rb_b;
  __m128i v_ra_b;
  __m128i _r;
  __m128i v_maxval_b;
  __m128i v_shuffle_b;
  undefined4 in_stack_fffffffffffffc34;
  int in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc48;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 in_stack_fffffffffffffc78 [16];
  __m128i *in_stack_fffffffffffffc88;
  uint8_t *in_stack_fffffffffffffc90;
  uint8_t *in_stack_fffffffffffffc98;
  uint8_t *puStack_360;
  ulong local_338;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ulong local_288;
  uint32_t in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  ulong local_208;
  void *local_1e8;
  ulong local_1d8;
  ulong local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  uint32_t in_stack_fffffffffffffecc;
  undefined7 in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffedc;
  uint8_t *in_stack_fffffffffffffee0;
  uint32_t in_stack_fffffffffffffeec;
  uint8_t *in_stack_fffffffffffffef0;
  undefined8 local_e8;
  uint8_t *puStack_e0;
  
  uVar14 = in_RSI;
  xx_loadu_128("");
  auVar16 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar16 = vpinsrb_avx(auVar16,0x40,2);
  auVar16 = vpinsrb_avx(auVar16,0x40,3);
  auVar16 = vpinsrb_avx(auVar16,0x40,4);
  auVar16 = vpinsrb_avx(auVar16,0x40,5);
  auVar16 = vpinsrb_avx(auVar16,0x40,6);
  auVar16 = vpinsrb_avx(auVar16,0x40,7);
  auVar16 = vpinsrb_avx(auVar16,0x40,8);
  auVar16 = vpinsrb_avx(auVar16,0x40,9);
  auVar16 = vpinsrb_avx(auVar16,0x40,10);
  auVar16 = vpinsrb_avx(auVar16,0x40,0xb);
  auVar16 = vpinsrb_avx(auVar16,0x40,0xc);
  auVar16 = vpinsrb_avx(auVar16,0x40,0xd);
  auVar16 = vpinsrb_avx(auVar16,0x40,0xe);
  auVar16 = vpinsrb_avx(auVar16,0x40,0xf);
  local_e8 = auVar16._0_8_;
  puStack_e0 = auVar16._8_8_;
  auVar17 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar17 = vpinsrw_avx(auVar17,0x200,2);
  auVar17 = vpinsrw_avx(auVar17,0x200,3);
  auVar17 = vpinsrw_avx(auVar17,0x200,4);
  auVar17 = vpinsrw_avx(auVar17,0x200,5);
  auVar17 = vpinsrw_avx(auVar17,0x200,6);
  auVar17 = vpinsrw_avx(auVar17,0x200,7);
  local_198 = auVar17._0_8_;
  uStack_190 = auVar17._8_8_;
  local_208 = in_R8;
  local_1e8 = in_RDI;
  if (in_stack_00000018 == 4) {
    do {
      xx_loadl_64(in_stack_00000008);
      uVar15 = local_198;
      uVar19 = uStack_190;
      alVar20 = xx_loadl_64((void *)((long)in_stack_00000008 + (ulong)in_stack_00000010));
      auVar9._8_8_ = uStack_190;
      auVar9._0_8_ = local_198;
      auVar8._8_8_ = uVar19;
      auVar8._0_8_ = uVar15;
      auVar16 = vpaddb_avx(auVar9,auVar8);
      auVar11._8_8_ = in_XMM0_Qb;
      auVar11._0_8_ = in_XMM0_Qa;
      auVar17 = vpshufb_avx(auVar16,auVar11);
      local_288 = auVar17._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_288;
      auVar16 = vpmovzxbw_avx(auVar16);
      auVar17 = vpsrldq_avx(auVar17,8);
      local_1b8 = auVar17._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_1b8;
      auVar17 = vpmovzxbw_avx(auVar17);
      auVar16 = vpaddw_avx(auVar16,auVar17);
      local_2b8 = auVar16._0_8_;
      uStack_2b0 = auVar16._8_8_;
      v_val_w[1] = uVar14;
      v_val_w[0] = 2;
      xx_roundn_epu16(v_val_w,(int)alVar20[1]);
      auVar5._8_8_ = uStack_2b0;
      auVar5._0_8_ = local_2b8;
      auVar18._8_8_ = uStack_2b0;
      auVar18._0_8_ = local_2b8;
      auVar16 = vpackuswb_avx(auVar5,auVar18);
      auVar13._8_8_ = puStack_e0;
      auVar13._0_8_ = local_e8;
      auVar16 = vpsubb_avx(auVar13,auVar16);
      uVar14 = local_208;
      alVar20 = blend_4_u8(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                           in_stack_fffffffffffffc88,in_stack_fffffffffffffc78._8_8_,
                           in_stack_fffffffffffffc78._0_8_);
      local_2f8 = auVar16._0_8_;
      uStack_2f0 = auVar16._8_8_;
      alVar20[0] = uVar14;
      local_198 = local_2f8;
      uStack_190 = uStack_2f0;
      xx_storel_32(local_1e8,alVar20);
      local_1e8 = (void *)((long)local_1e8 + (in_RSI & 0xffffffff));
      local_208 = local_208 + in_R9D;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 1));
      in_stack_00000020 = in_stack_00000020 - 1;
    } while (in_stack_00000020 != 0);
  }
  else if (in_stack_00000018 == 8) {
    do {
      xx_loadu_128(in_stack_00000008);
      uVar15 = local_198;
      uVar19 = uStack_190;
      alVar20 = xx_loadu_128((void *)((long)in_stack_00000008 + (ulong)in_stack_00000010));
      auVar7._8_8_ = uStack_190;
      auVar7._0_8_ = local_198;
      auVar6._8_8_ = uVar19;
      auVar6._0_8_ = uVar15;
      auVar16 = vpaddb_avx(auVar7,auVar6);
      auVar10._8_8_ = in_XMM0_Qb;
      auVar10._0_8_ = in_XMM0_Qa;
      auVar17 = vpshufb_avx(auVar16,auVar10);
      local_338 = auVar17._0_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_338;
      auVar16 = vpmovzxbw_avx(auVar1);
      auVar17 = vpsrldq_avx(auVar17,8);
      local_1d8 = auVar17._0_8_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_1d8;
      auVar17 = vpmovzxbw_avx(auVar2);
      auVar17 = vpaddw_avx(auVar16,auVar17);
      puStack_360 = auVar17._8_8_;
      v_val_w_00[1] = uVar14;
      v_val_w_00[0] = 2;
      v_m0_b_00 = auVar17._0_8_;
      xx_roundn_epu16(v_val_w_00,(int)alVar20[1]);
      auVar4._8_8_ = puStack_360;
      auVar4._0_8_ = v_m0_b_00;
      auVar3._8_8_ = puStack_360;
      auVar3._0_8_ = v_m0_b_00;
      auVar16 = vpackuswb_avx(auVar4,auVar3);
      auVar12._8_8_ = puStack_e0;
      auVar12._0_8_ = local_e8;
      auVar18 = vpsubb_avx(auVar12,auVar16);
      uVar14 = local_208;
      alVar20 = blend_8_u8((uint8_t *)auVar17._0_8_,puStack_360,v_m0_b_00,auVar16._8_8_,
                           auVar16._0_8_);
      v[1] = alVar20[1];
      local_3a8 = auVar18._0_8_;
      uStack_3a0 = auVar18._8_8_;
      v[0] = uVar14;
      local_198 = local_3a8;
      uStack_190 = uStack_3a0;
      xx_storel_64(local_1e8,v);
      local_1e8 = (void *)((long)local_1e8 + (in_RSI & 0xffffffff));
      local_208 = local_208 + in_R9D;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 1));
      in_stack_00000020 = in_stack_00000020 - 1;
    } while (in_stack_00000020 != 0);
  }
  else if (in_stack_00000018 == 0x10) {
    blend_a64_mask_sx_sy_w16_avx2
              ((uint8_t *)CONCAT44(in_R9D,in_stack_fffffffffffffdf0),in_stack_fffffffffffffdec,
               in_XMM0_Qb,(uint32_t)((ulong)in_XMM0_Qa >> 0x20),puStack_e0,auVar16._4_4_,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffc34,in_stack_00000010),in_stack_00000020,
               in_stack_fffffffffffffc40);
  }
  else {
    blend_a64_mask_sx_sy_w32n_avx2
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc,(uint8_t *)CONCAT17(0x40,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffc34,in_stack_00000010),in_stack_00000018,
               in_stack_00000020,in_stack_fffffffffffffc48);
  }
  return;
}

Assistant:

static inline void blend_a64_mask_sx_sy_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  switch (w) {
    case 4:
      do {
        const __m128i v_ra_b = xx_loadl_64(mask);
        const __m128i v_rb_b = xx_loadl_64(mask + mask_stride);
        const __m128i v_rvs_b = _mm_add_epi8(v_ra_b, v_rb_b);
        const __m128i v_r_s_b = _mm_shuffle_epi8(v_rvs_b, v_shuffle_b);
        const __m128i v_r0_s_w = _mm_cvtepu8_epi16(v_r_s_b);
        const __m128i v_r1_s_w = _mm_cvtepu8_epi16(_mm_srli_si128(v_r_s_b, 8));
        const __m128i v_rs_w = _mm_add_epi16(v_r0_s_w, v_r1_s_w);
        const __m128i v_m0_w = xx_roundn_epu16(v_rs_w, 2);
        const __m128i v_m0_b = _mm_packus_epi16(v_m0_w, v_m0_w);
        const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

        const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

        xx_storel_32(dst, v_res_b);

        dst += dst_stride;
        src0 += src0_stride;
        src1 += src1_stride;
        mask += 2 * mask_stride;
      } while (--h);
      break;
    case 8:
      do {
        const __m128i v_ra_b = xx_loadu_128(mask);
        const __m128i v_rb_b = xx_loadu_128(mask + mask_stride);
        const __m128i v_rvs_b = _mm_add_epi8(v_ra_b, v_rb_b);
        const __m128i v_r_s_b = _mm_shuffle_epi8(v_rvs_b, v_shuffle_b);
        const __m128i v_r0_s_w = _mm_cvtepu8_epi16(v_r_s_b);
        const __m128i v_r1_s_w = _mm_cvtepu8_epi16(_mm_srli_si128(v_r_s_b, 8));
        const __m128i v_rs_w = _mm_add_epi16(v_r0_s_w, v_r1_s_w);
        const __m128i v_m0_w = xx_roundn_epu16(v_rs_w, 2);
        const __m128i v_m0_b = _mm_packus_epi16(v_m0_w, v_m0_w);
        const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

        const __m128i v_res_b = blend_8_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

        xx_storel_64(dst, v_res_b);

        dst += dst_stride;
        src0 += src0_stride;
        src1 += src1_stride;
        mask += 2 * mask_stride;
      } while (--h);
      break;
    case 16:
      blend_a64_mask_sx_sy_w16_avx2(dst, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, h);
      break;
    default:
      blend_a64_mask_sx_sy_w32n_avx2(dst, dst_stride, src0, src0_stride, src1,
                                     src1_stride, mask, mask_stride, w, h);
      break;
  }
}